

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuParamGenerator<bool>::iuParamGenerator
          (iuParamGenerator<bool> *this,iuParamGenerator<bool> *param_1)

{
  iuParamGenerator<bool> *param_1_local;
  iuParamGenerator<bool> *this_local;
  
  iuIParamGenerator<bool>::iuIParamGenerator
            (&this->super_iuIParamGenerator<bool>,&param_1->super_iuIParamGenerator<bool>);
  (this->super_iuIParamGenerator<bool>)._vptr_iuIParamGenerator =
       (_func_int **)&PTR__iuParamGenerator_0061ee30;
  this->m_pInterface = param_1->m_pInterface;
  return;
}

Assistant:

class iuParamGenerator IUTEST_CXX_FINAL : public iuIParamGenerator<T>
{
    typedef iuIParamGenerator<T> _Interface;
    typedef iuParamGenerator<T>  _Myt;
public:
    typedef T type;
public:
    iuParamGenerator(_Interface* pInterface=NULL) : m_pInterface(pInterface) {} // NOLINT

public:
    operator iuIParamGenerator<T>* () const { return m_pInterface; }

public:
#if IUTEST_HAS_CONCAT
    template<typename Other>
    iuConcatParamHolder<_Myt, Other> operator + (const Other& g) const
    {
        return iuConcatParamHolder<_Myt, Other>(*this, g);
    }
#endif

public:
    virtual void    Begin() IUTEST_CXX_OVERRIDE { m_pInterface->Begin(); }